

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

void __thiscall MarkerIndex::insert(MarkerIndex *this,MarkerId id,Point start,Point end)

{
  int iVar1;
  Node *node;
  Node *node_00;
  __hashtable *__h_3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_MarkerIndex::Node_*const,_Point>,_false,_false>,_bool>
  pVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false,_false>,_bool>
  pVar3;
  Point local_58;
  Node *local_50;
  Point local_48;
  Point local_40;
  MarkerId local_34;
  
  local_58 = start;
  local_40 = end;
  local_34 = id;
  node = Iterator::insert_marker_start(&this->iterator,&local_34,&local_58,&local_40);
  node_00 = Iterator::insert_marker_end(&this->iterator,&local_34,&local_58,&local_40);
  local_48 = local_58;
  local_50 = node;
  pVar2 = std::
          _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
                    ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->node_position_cache,&local_50);
  local_48 = local_40;
  local_50 = node_00;
  std::
  _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
            ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->node_position_cache,&local_50,pVar2._8_8_);
  flat_set<unsigned_int>::insert(&node->start_marker_ids,id);
  flat_set<unsigned_int>::insert(&node_00->end_marker_ids,id);
  if (node->priority == 0) {
    iVar1 = generate_random_number(this);
    node->priority = iVar1;
    bubble_node_up(this,node);
  }
  if (node_00->priority == 0) {
    iVar1 = generate_random_number(this);
    node_00->priority = iVar1;
    bubble_node_up(this,node_00);
  }
  local_48 = (Point)node;
  local_50._0_4_ = id;
  pVar3 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,MarkerIndex::Node*>,std::allocator<std::pair<unsigned_int_const,MarkerIndex::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int_const,MarkerIndex::Node*>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,MarkerIndex::Node*>,std::allocator<std::pair<unsigned_int_const,MarkerIndex::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->start_nodes_by_id,&local_50);
  local_50 = (Node *)CONCAT44(local_50._4_4_,id);
  local_48 = (Point)node_00;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,MarkerIndex::Node*>,std::allocator<std::pair<unsigned_int_const,MarkerIndex::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int_const,MarkerIndex::Node*>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,MarkerIndex::Node*>,std::allocator<std::pair<unsigned_int_const,MarkerIndex::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->end_nodes_by_id,&local_50,pVar3._8_8_);
  return;
}

Assistant:

void MarkerIndex::insert(MarkerId id, Point start, Point end) {
  Node *start_node = iterator.insert_marker_start(id, start, end);
  Node *end_node = iterator.insert_marker_end(id, start, end);

  node_position_cache.insert({start_node, start});
  node_position_cache.insert({end_node, end});

  start_node->start_marker_ids.insert(id);
  end_node->end_marker_ids.insert(id);

  if (start_node->priority == 0) {
    start_node->priority = generate_random_number();
    bubble_node_up(start_node);
  }

  if (end_node->priority == 0) {
    end_node->priority = generate_random_number();
    bubble_node_up(end_node);
  }

  start_nodes_by_id.insert({id, start_node});
  end_nodes_by_id.insert({id, end_node});
}